

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall JetHead::Socket::close(Socket *this)

{
  int in_ESI;
  
  close((Socket *)(this[-1].mLastDatagramSender.mName + 8),in_ESI);
  return;
}

Assistant:

JetHead::ErrCode Socket::close()
{
	int res = 0;
	if ( mFd != -1 )
	{
		setConnected( false );
		res = ::close( mFd );
		mFd = -1;
		if ( res == -1 )
			return getErrorCode( errno );
	}
	else
		return JetHead::kNotInitialized;
	
	return JetHead::kNoError;
}